

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransportMan.cpp
# Opt level: O1

void __thiscall
adios2::transportman::TransportMan::WriteFiles
          (TransportMan *this,iovec *iov,size_t iovcnt,int transportIndex)

{
  _Hash_node_base *p_Var1;
  uint uVar2;
  int iVar3;
  long *plVar4;
  uint uVar5;
  _Hash_node_base *p_Var6;
  size_t *psVar7;
  ulong uVar8;
  ulong uVar9;
  uint __val;
  TransportMan *this_00;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  uint __len;
  string __str;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false>
  local_78;
  _func_int **local_70;
  _func_int *local_60 [2];
  string local_50;
  
  if (transportIndex == -1) {
    for (p_Var6 = (this->m_Transports)._M_h._M_before_begin._M_nxt; p_Var6 != (_Hash_node_base *)0x0
        ; p_Var6 = p_Var6->_M_nxt) {
      iVar3 = std::__cxx11::string::compare((char *)(p_Var6[2]._M_nxt + 1));
      if (iVar3 == 0) {
        (*(code *)(p_Var6[2]._M_nxt)->_M_nxt[7]._M_nxt)
                  (p_Var6[2]._M_nxt,iov,iovcnt & 0xffffffff,0xffffffffffffffff);
      }
    }
  }
  else {
    p_Var6 = (_Hash_node_base *)(long)transportIndex;
    uVar9 = (this->m_Transports)._M_h._M_bucket_count;
    uVar8 = (ulong)p_Var6 % uVar9;
    p_Var10 = (this->m_Transports)._M_h._M_buckets[uVar8];
    p_Var11 = (__node_base_ptr)0x0;
    if ((p_Var10 != (__node_base_ptr)0x0) &&
       (p_Var1 = p_Var10->_M_nxt, p_Var11 = p_Var10, p_Var10->_M_nxt[1]._M_nxt != p_Var6)) {
      while (p_Var10 = p_Var1, p_Var1 = p_Var10->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
        p_Var11 = (__node_base_ptr)0x0;
        if (((ulong)p_Var1[1]._M_nxt % uVar9 != uVar8) ||
           (p_Var11 = p_Var10, p_Var1[1]._M_nxt == p_Var6)) goto LAB_0064cce7;
      }
      p_Var11 = (__node_base_ptr)0x0;
    }
LAB_0064cce7:
    if (p_Var11 == (__node_base_ptr)0x0) {
      local_78._M_cur = (__node_type *)0x0;
    }
    else {
      local_78._M_cur = (__node_type *)p_Var11->_M_nxt;
    }
    __val = -transportIndex;
    if (0 < transportIndex) {
      __val = transportIndex;
    }
    __len = 1;
    if (9 < __val) {
      uVar9 = (ulong)__val;
      uVar2 = 4;
      do {
        __len = uVar2;
        uVar5 = (uint)uVar9;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_0064cd5a;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_0064cd5a;
        }
        if (uVar5 < 10000) goto LAB_0064cd5a;
        uVar9 = uVar9 / 10000;
        uVar2 = __len + 4;
      } while (99999 < uVar5);
      __len = __len + 1;
    }
LAB_0064cd5a:
    local_70 = local_60;
    this_00 = (TransportMan *)&local_70;
    std::__cxx11::string::_M_construct((ulong)this_00,(char)__len - (char)(transportIndex >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)((uint)transportIndex >> 0x1f) + (long)local_70),__len,__val);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)this_00,0,(char *)0x0,0x75eb1a);
    psVar7 = (size_t *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_50.field_2._M_allocated_capacity = *psVar7;
      local_50.field_2._8_8_ = plVar4[3];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar7;
      local_50._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_50._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    CheckFile(this_00,(const_iterator)local_78._M_cur,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    (**(code **)(**(long **)((long)local_78._M_cur + 0x10) + 0x38))
              (*(long **)((long)local_78._M_cur + 0x10),iov,iovcnt & 0xffffffff,0xffffffffffffffff);
  }
  return;
}

Assistant:

void TransportMan::WriteFiles(const core::iovec *iov, const size_t iovcnt, const int transportIndex)
{
    if (transportIndex == -1)
    {
        for (auto &transportPair : m_Transports)
        {
            auto &transport = transportPair.second;
            if (transport->m_Type == "File")
            {
                transport->WriteV(iov, static_cast<int>(iovcnt));
            }
        }
    }
    else
    {
        auto itTransport = m_Transports.find(transportIndex);
        CheckFile(itTransport,
                  ", in call to WriteFiles with index " + std::to_string(transportIndex));
        itTransport->second->WriteV(iov, static_cast<int>(iovcnt));
    }
}